

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  BYTE *pBVar10;
  U32 UVar11;
  uint uVar12;
  int *mEnd;
  BYTE *pBVar13;
  uint uVar14;
  long lVar15;
  int *piVar16;
  ZSTD_matchState_t *ms_00;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int *ip;
  seqStore_t *psVar20;
  ulong uVar21;
  ulong uVar22;
  size_t ofbCandidate;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  int *local_d8;
  int *local_d0;
  BYTE *local_c8;
  int local_c0;
  uint local_bc;
  int *local_b8;
  ulong local_b0;
  ZSTD_matchState_t *local_a8;
  uint local_9c;
  ulong local_98;
  U32 maxDistance;
  undefined4 uStack_8c;
  BYTE *local_88;
  BYTE *local_80;
  int *local_78;
  int *local_70;
  uint local_64;
  seqStore_t *local_60;
  ulong local_58;
  int *local_50;
  size_t local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_c8 = (ms->window).base;
  local_80 = (ms->window).dictBase;
  local_b0 = (ulong)(ms->window).dictLimit;
  local_70 = (int *)(local_80 + local_b0);
  local_40 = local_80 + (ms->window).lowLimit;
  local_98 = CONCAT44(local_98._4_4_,(ms->cParams).windowLog);
  local_dc = (ms->cParams).minMatch;
  if (5 < local_dc) {
    local_dc = 6;
  }
  if (local_dc < 5) {
    local_dc = 4;
  }
  local_9c = (ms->cParams).searchLog;
  local_e4 = 6;
  if (local_9c < 6) {
    local_e4 = local_9c;
  }
  if (local_e4 < 5) {
    local_e4 = 4;
  }
  local_e0 = *rep;
  local_bc = rep[1];
  ms->lazySkipping = 0;
  local_88 = local_c8 + local_b0;
  ip = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_78 = (int *)((long)src + (srcSize - 0x10));
  piVar16 = (int *)(ulong)ms->nextToUpdate;
  uVar14 = ((int)local_78 - (int)(local_c8 + (long)piVar16)) + 1;
  if (7 < uVar14) {
    uVar14 = 8;
  }
  uVar19 = 0;
  if (local_c8 + (long)piVar16 <= local_78) {
    uVar19 = uVar14;
  }
  iEnd = (int *)((long)src + srcSize);
  local_d8 = (int *)(ulong)(uVar19 + ms->nextToUpdate);
  UVar2 = ms->rowHashLog;
  _maxDistance = (ulong)(0x38 - UVar2);
  local_c0 = 0x18 - UVar2;
  local_48 = 1L << ((byte)local_e4 & 0x3f);
  pUVar3 = ms->hashTable;
  pBVar10 = ms->tagTable;
  local_d0 = (int *)src;
  local_a8 = ms;
  local_60 = seqStore;
  local_38 = rep;
  for (; piVar16 < local_d8; piVar16 = (int *)((long)piVar16 + 1)) {
    if (0x20 < UVar2 + 8) {
LAB_001cfd2d:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (local_dc == 5) {
      uVar21 = *(long *)(local_c8 + (long)piVar16) * -0x30e4432345000000;
LAB_001cf084:
      uVar21 = (uVar21 ^ local_a8->hashSalt) >> ((byte)_maxDistance & 0x3f);
    }
    else {
      if (local_dc == 6) {
        uVar21 = *(long *)(local_c8 + (long)piVar16) * -0x30e4432340650000;
        goto LAB_001cf084;
      }
      uVar21 = (ulong)((*(int *)(local_c8 + (long)piVar16) * -0x61c8864f ^ (uint)local_a8->hashSalt)
                      >> ((byte)local_c0 & 0x1f));
    }
    uVar14 = ((uint)(uVar21 >> 8) & 0xffffff) << ((byte)local_e4 & 0x1f);
    if (((ulong)(pUVar3 + uVar14) & 0x3f) != 0) {
LAB_001cfd4c:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32e,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    iVar6 = ZSTD_isAligned(pBVar10 + uVar14,local_48);
    if (iVar6 == 0) {
LAB_001cfd6b:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x32f,"void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)"
                   );
    }
    local_a8->hashCache[(uint)piVar16 & 7] = (U32)uVar21;
  }
  _maxDistance = CONCAT44(uStack_8c,1 << ((byte)local_98 & 0x1f));
  local_c0 = (int)local_b0 + -1;
  local_50 = iEnd + -8;
  uVar7 = local_e0;
  uVar19 = local_bc;
  uVar14 = local_dc;
  ms_00 = local_a8;
LAB_001cf163:
  do {
    local_bc = uVar19;
    local_e0 = uVar7;
    if (local_78 <= ip) {
      *local_38 = local_e0;
      local_38[1] = local_bc;
      return (long)iEnd - (long)local_d0;
    }
    uVar19 = (int)ip - (int)local_c8;
    uVar21 = (ulong)uVar19;
    iVar6 = uVar19 + 1;
    UVar2 = (ms_00->window).lowLimit;
    UVar11 = iVar6 - maxDistance;
    if (iVar6 - UVar2 <= maxDistance) {
      UVar11 = UVar2;
    }
    if (ms_00->loadedDictEnd != 0) {
      UVar11 = UVar2;
    }
    uVar7 = iVar6 - local_e0;
    pBVar10 = local_80;
    if ((uint)local_b0 <= uVar7) {
      pBVar10 = local_c8;
    }
    piVar16 = (int *)((long)ip + 1);
    if (local_c0 - uVar7 < 3) {
LAB_001cf208:
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      if (local_e0 <= (uVar19 - UVar11) + 1) {
        if (*piVar16 != *(int *)(pBVar10 + uVar7)) goto LAB_001cf208;
        mEnd = local_70;
        if ((uint)local_b0 <= uVar7) {
          mEnd = iEnd;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar10 + uVar7) + 4),(BYTE *)iEnd
                           ,(BYTE *)mEnd,local_88);
        uVar17 = sVar8 + 4;
      }
    }
    ofbCandidate = 999999999;
    local_d8 = piVar16;
    if (uVar14 == 6) {
      if (local_e4 == 6) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_6_6(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_e4 == 5) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_6_5(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_RowFindBestMatch_extDict_6_4(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
    }
    else if (uVar14 == 5) {
      if (local_e4 == 6) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_5_6(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_e4 == 5) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_5_5(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_RowFindBestMatch_extDict_5_4(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
    }
    else if (local_e4 == 6) {
      uVar9 = ZSTD_RowFindBestMatch_extDict_4_6(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (local_e4 == 5) {
      uVar9 = ZSTD_RowFindBestMatch_extDict_4_5(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar9 = ZSTD_RowFindBestMatch_extDict_4_4(ms_00,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar22 = uVar17;
    if (uVar17 < uVar9) {
      uVar22 = uVar9;
    }
    if (3 < uVar22) {
      uVar18 = 1;
      if (uVar17 < uVar9) {
        uVar18 = ofbCandidate;
        local_d8 = ip;
      }
      while (ip < local_78) {
        local_b8 = (int *)((long)ip + 1);
        local_64 = (int)uVar21 + 1;
        local_98 = uVar21;
        if (uVar18 == 0) {
          uVar18 = 0;
        }
        else {
          UVar2 = (ms_00->window).lowLimit;
          UVar11 = local_64 - maxDistance;
          if (local_64 - UVar2 <= maxDistance) {
            UVar11 = UVar2;
          }
          if (ms_00->loadedDictEnd != 0) {
            UVar11 = UVar2;
          }
          uVar19 = local_64 - local_e0;
          pBVar10 = local_c8;
          if (uVar19 < (uint)local_b0) {
            pBVar10 = local_80;
          }
          if (((2 < local_c0 - uVar19) && (local_e0 <= local_64 - UVar11)) &&
             (*local_b8 == *(int *)(pBVar10 + uVar19))) {
            piVar16 = iEnd;
            if (uVar19 < (uint)local_b0) {
              piVar16 = local_70;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar10 + uVar19) + 4),
                               (BYTE *)iEnd,(BYTE *)piVar16,local_88);
            local_58 = uVar18;
            uVar19 = ZSTD_highbit32((U32)uVar18);
            uVar18 = local_58;
            if ((sVar8 < 0xfffffffffffffffc) &&
               ((int)(((int)uVar22 * 3 - uVar19) + 1) < (int)(sVar8 + 4) * 3)) {
              local_d8 = local_b8;
              uVar18 = 1;
              uVar22 = sVar8 + 4;
            }
          }
        }
        ofbCandidate = 999999999;
        if (uVar14 == 6) {
          if (local_e4 == 6) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_6_6
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_e4 == 5) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_6_5
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar17 = ZSTD_RowFindBestMatch_extDict_6_4
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (uVar14 == 5) {
          if (local_e4 == 6) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_5_6
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_e4 == 5) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_5_5
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar17 = ZSTD_RowFindBestMatch_extDict_5_4
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
        }
        else if (local_e4 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_4_6
                             (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
        }
        else if (local_e4 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_4_5
                             (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_extDict_4_4
                             (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
        }
        sVar8 = ofbCandidate;
        uVar14 = ZSTD_highbit32((U32)ofbCandidate);
        uVar19 = ZSTD_highbit32((U32)uVar18);
        ms_00 = local_a8;
        if ((uVar17 < 4) ||
           ((int)((int)uVar17 * 4 - uVar14) <= (int)(((int)uVar22 * 4 - uVar19) + 4))) {
          if (local_78 <= local_b8) break;
          local_b8 = (int *)((long)ip + 2);
          uVar14 = (int)local_98 + 2;
          uVar21 = (ulong)uVar14;
          if (uVar18 == 0) {
            uVar18 = 0;
          }
          else {
            UVar2 = (local_a8->window).lowLimit;
            UVar11 = uVar14 - maxDistance;
            if (uVar14 - UVar2 <= maxDistance) {
              UVar11 = UVar2;
            }
            if (local_a8->loadedDictEnd != 0) {
              UVar11 = UVar2;
            }
            uVar19 = uVar14 - local_e0;
            pBVar10 = local_c8;
            if (uVar19 < (uint)local_b0) {
              pBVar10 = local_80;
            }
            if (((2 < local_c0 - uVar19) && (local_e0 <= uVar14 - UVar11)) &&
               (*local_b8 == *(int *)(pBVar10 + uVar19))) {
              piVar16 = iEnd;
              if (uVar19 < (uint)local_b0) {
                piVar16 = local_70;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)ip + 6),(BYTE *)((long)(pBVar10 + uVar19) + 4),
                                 (BYTE *)iEnd,(BYTE *)piVar16,local_88);
              uVar14 = ZSTD_highbit32((U32)uVar18);
              if ((sVar8 < 0xfffffffffffffffc) &&
                 ((int)(((int)uVar22 * 4 + 1) - uVar14) < (int)(sVar8 + 4) * 4)) {
                local_d8 = local_b8;
                uVar18 = 1;
                uVar22 = sVar8 + 4;
              }
            }
          }
          ofbCandidate = 999999999;
          local_98 = uVar21;
          if (local_dc == 6) {
            if (local_e4 == 6) {
              uVar17 = ZSTD_RowFindBestMatch_extDict_6_6
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
            else if (local_e4 == 5) {
              uVar17 = ZSTD_RowFindBestMatch_extDict_6_5
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
            else {
              uVar17 = ZSTD_RowFindBestMatch_extDict_6_4
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
          }
          else if (local_dc == 5) {
            if (local_e4 == 6) {
              uVar17 = ZSTD_RowFindBestMatch_extDict_5_6
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
            else if (local_e4 == 5) {
              uVar17 = ZSTD_RowFindBestMatch_extDict_5_5
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
            else {
              uVar17 = ZSTD_RowFindBestMatch_extDict_5_4
                                 (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
            }
          }
          else if (local_e4 == 6) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_4_6
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else if (local_e4 == 5) {
            uVar17 = ZSTD_RowFindBestMatch_extDict_4_5
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          else {
            uVar17 = ZSTD_RowFindBestMatch_extDict_4_4
                               (ms_00,(BYTE *)local_b8,(BYTE *)iEnd,&ofbCandidate);
          }
          sVar8 = ofbCandidate;
          uVar14 = ZSTD_highbit32((U32)ofbCandidate);
          uVar19 = ZSTD_highbit32((U32)uVar18);
          if ((uVar17 < 4) ||
             ((int)((int)uVar17 * 4 - uVar14) <= (int)(((int)uVar22 * 4 - uVar19) + 7))) break;
          local_d8 = local_b8;
          uVar21 = local_98;
          uVar18 = sVar8;
          ip = local_b8;
          uVar22 = uVar17;
          uVar14 = local_dc;
        }
        else {
          local_d8 = local_b8;
          uVar21 = (ulong)local_64;
          uVar18 = sVar8;
          ip = local_b8;
          uVar22 = uVar17;
          uVar14 = local_dc;
        }
      }
      psVar20 = local_60;
      uVar14 = local_e0;
      if (3 < uVar18) {
        uVar21 = (long)local_d8 + (-(long)local_c8 - uVar18) + 3;
        pBVar13 = local_88;
        pBVar10 = local_c8;
        if ((uint)uVar21 < (uint)local_b0) {
          pBVar13 = local_40;
          pBVar10 = local_80;
        }
        pBVar10 = pBVar10 + (uVar21 & 0xffffffff);
        for (; ((local_d0 < local_d8 && (pBVar13 < pBVar10)) &&
               (*(BYTE *)((long)local_d8 + -1) == pBVar10[-1]));
            local_d8 = (int *)((long)local_d8 + -1)) {
          pBVar10 = pBVar10 + -1;
          uVar22 = uVar22 + 1;
        }
        local_bc = local_e0;
        uVar14 = (U32)uVar18 - 3;
      }
      if (local_60->maxNbSeq <=
          (ulong)((long)local_60->sequences - (long)local_60->sequencesStart >> 3)) {
LAB_001cfd8a:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_60->maxNbLit) {
LAB_001cfde7:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar21 = (long)local_d8 - (long)local_d0;
      pBVar10 = local_60->lit;
      if (local_60->litStart + local_60->maxNbLit < pBVar10 + uVar21) {
LAB_001cfda9:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < local_d8) {
LAB_001cfdc8:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_50 < local_d8) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)local_d0,(BYTE *)local_d8,(BYTE *)local_50);
LAB_001cf8f3:
        psVar20->lit = psVar20->lit + uVar21;
        if (0xffff < uVar21) {
          if (psVar20->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar20->longLengthType = ZSTD_llt_literalLength;
          psVar20->longLengthPos =
               (U32)((ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart) >> 3);
        }
      }
      else {
        uVar5 = *(undefined8 *)(local_d0 + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)local_d0;
        *(undefined8 *)(pBVar10 + 8) = uVar5;
        pBVar10 = local_60->lit;
        if (0x10 < uVar21) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar10 + 0x10 + (-0x10 - (long)(local_d0 + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar5 = *(undefined8 *)(local_d0 + 6);
          *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(local_d0 + 4);
          *(undefined8 *)(pBVar10 + 0x18) = uVar5;
          if (0x20 < (long)uVar21) {
            lVar15 = 0;
            do {
              puVar1 = (undefined8 *)((long)local_d0 + lVar15 + 0x20);
              uVar5 = puVar1[1];
              pBVar13 = pBVar10 + lVar15 + 0x20;
              *(undefined8 *)pBVar13 = *puVar1;
              *(undefined8 *)(pBVar13 + 8) = uVar5;
              puVar1 = (undefined8 *)((long)local_d0 + lVar15 + 0x30);
              uVar5 = puVar1[1];
              *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
              *(undefined8 *)(pBVar13 + 0x18) = uVar5;
              lVar15 = lVar15 + 0x20;
            } while (pBVar13 + 0x20 < pBVar10 + uVar21);
          }
          goto LAB_001cf8f3;
        }
        local_60->lit = pBVar10 + uVar21;
      }
      psVar4 = psVar20->sequences;
      psVar4->litLength = (U16)uVar21;
      psVar4->offBase = (U32)uVar18;
      if (uVar22 < 3) {
LAB_001cfe06:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < uVar22 - 3) {
        if (psVar20->longLengthType != ZSTD_llt_none) {
LAB_001cfe25:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar20->longLengthType = ZSTD_llt_matchLength;
        psVar20->longLengthPos = (U32)((ulong)((long)psVar4 - (long)psVar20->sequencesStart) >> 3);
      }
      psVar4->mlBase = (U16)(uVar22 - 3);
      psVar20->sequences = psVar4 + 1;
      if (ms_00->lazySkipping != 0) {
        uVar19 = ms_00->nextToUpdate;
        uVar21 = (ulong)uVar19;
        UVar2 = ms_00->rowHashLog;
        uVar7 = ((int)local_78 - (int)(local_c8 + uVar21)) + 1;
        if (7 < uVar7) {
          uVar7 = 8;
        }
        if (local_78 < local_c8 + uVar21) {
          uVar7 = 0;
        }
        pUVar3 = ms_00->hashTable;
        pBVar10 = ms_00->tagTable;
        local_d0 = (int *)CONCAT44(local_d0._4_4_,UVar2 + 8);
        local_98 = (ulong)(0x38 - UVar2);
        local_b8 = (int *)CONCAT44(local_b8._4_4_,0x18 - UVar2);
        local_e0 = uVar14;
        for (; uVar21 < uVar7 + uVar19; uVar21 = uVar21 + 1) {
          if (0x20 < (uint)local_d0) goto LAB_001cfd2d;
          if (local_dc == 5) {
            uVar17 = *(long *)(local_c8 + uVar21) * -0x30e4432345000000;
LAB_001cfaba:
            uVar17 = (uVar17 ^ local_a8->hashSalt) >> ((byte)local_98 & 0x3f);
          }
          else {
            if (local_dc == 6) {
              uVar17 = *(long *)(local_c8 + uVar21) * -0x30e4432340650000;
              goto LAB_001cfaba;
            }
            uVar17 = (ulong)((*(int *)(local_c8 + uVar21) * -0x61c8864f ^ (uint)local_a8->hashSalt)
                            >> ((byte)local_b8 & 0x1f));
          }
          uVar14 = ((uint)(uVar17 >> 8) & 0xffffff) << ((byte)local_e4 & 0x1f);
          if (((ulong)(pUVar3 + uVar14) & 0x3f) != 0) goto LAB_001cfd4c;
          iVar6 = ZSTD_isAligned(pBVar10 + uVar14,local_48);
          if (iVar6 == 0) goto LAB_001cfd6b;
          local_a8->hashCache[(uint)uVar21 & 7] = (U32)uVar17;
        }
        local_a8->lazySkipping = 0;
        ms_00 = local_a8;
        psVar20 = local_60;
        uVar14 = local_e0;
      }
      ip = (int *)((long)local_d8 + uVar22);
      uVar19 = local_bc;
      while (uVar7 = uVar14, local_d0 = ip, uVar14 = local_dc, ip <= local_78) {
        iVar6 = (int)ip - (int)local_c8;
        UVar2 = (ms_00->window).lowLimit;
        UVar11 = iVar6 - maxDistance;
        if (iVar6 - UVar2 <= maxDistance) {
          UVar11 = UVar2;
        }
        if (ms_00->loadedDictEnd != 0) {
          UVar11 = UVar2;
        }
        uVar12 = iVar6 - uVar19;
        pBVar10 = local_c8;
        if (uVar12 < (uint)local_b0) {
          pBVar10 = local_80;
        }
        if (((local_c0 - uVar12 < 3) || (iVar6 - UVar11 < uVar19)) ||
           (*ip != *(int *)(pBVar10 + uVar12))) break;
        piVar16 = iEnd;
        if (uVar12 < (uint)local_b0) {
          piVar16 = local_70;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar10 + uVar12) + 4),(BYTE *)iEnd,
                           (BYTE *)piVar16,local_88);
        if (psVar20->maxNbSeq <=
            (ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart >> 3))
        goto LAB_001cfd8a;
        if (0x20000 < psVar20->maxNbLit) goto LAB_001cfde7;
        pBVar10 = psVar20->lit;
        if (psVar20->litStart + psVar20->maxNbLit < pBVar10) goto LAB_001cfda9;
        if (iEnd < local_d0) goto LAB_001cfdc8;
        if (local_50 < local_d0) {
          ZSTD_safecopyLiterals(pBVar10,(BYTE *)local_d0,(BYTE *)local_d0,(BYTE *)local_50);
        }
        else {
          uVar5 = *(undefined8 *)(local_d0 + 2);
          *(undefined8 *)pBVar10 = *(undefined8 *)local_d0;
          *(undefined8 *)(pBVar10 + 8) = uVar5;
        }
        psVar4 = psVar20->sequences;
        psVar4->litLength = 0;
        psVar4->offBase = 1;
        if (sVar8 + 4 < 3) goto LAB_001cfe06;
        if (0xffff < sVar8 + 1) {
          if (psVar20->longLengthType != ZSTD_llt_none) goto LAB_001cfe25;
          psVar20->longLengthType = ZSTD_llt_matchLength;
          psVar20->longLengthPos = (U32)((ulong)((long)psVar4 - (long)psVar20->sequencesStart) >> 3)
          ;
        }
        psVar4->mlBase = (U16)(sVar8 + 1);
        psVar20->sequences = psVar4 + 1;
        uVar14 = uVar19;
        uVar19 = uVar7;
        ip = (int *)((long)local_d0 + sVar8 + 4);
      }
      goto LAB_001cf163;
    }
    uVar21 = (long)ip - (long)local_d0;
    ip = (int *)((long)ip + (uVar21 >> 8) + 1);
    ms_00->lazySkipping = (uint)(0x8ff < uVar21);
    uVar7 = local_e0;
    uVar19 = local_bc;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2);
}